

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O3

int start_cgreen_messaging(int tag)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  CgreenMessageQueue *pCVar4;
  char *pcVar5;
  int pipes [2];
  int local_10;
  int local_c;
  
  if ((queue_count == 0) && (iVar1 = atexit(clean_up_messaging), iVar1 != 0)) {
    pcVar5 = "could not register clean up code\n";
  }
  else {
    lVar3 = (long)queue_count;
    queue_count = queue_count + 1;
    pCVar4 = (CgreenMessageQueue *)realloc(queues,lVar3 * 0x10 + 0x10);
    if (pCVar4 == (CgreenMessageQueue *)0x0) {
      atexit(clean_up_messaging);
      return -1;
    }
    queues = pCVar4;
    iVar1 = cgreen_pipe_open(&local_10);
    pCVar4 = queues;
    if (iVar1 == 0) {
      lVar3 = (long)queue_count;
      queues[lVar3 + -1].readpipe = local_10;
      pCVar4[lVar3 + -1].writepipe = local_c;
      _Var2 = getpid();
      pCVar4 = queues;
      lVar3 = (long)queue_count;
      iVar1 = queue_count + -1;
      queues[lVar3 + -1].owner = _Var2;
      pCVar4[lVar3 + -1].tag = tag;
      return iVar1;
    }
    pcVar5 = "could not create pipes\n";
  }
  __fprintf_chk(_stderr,1,pcVar5);
  return -1;
}

Assistant:

int start_cgreen_messaging(int tag) {
    CgreenMessageQueue *tmp;
    int pipes[2];
    int pipe_result;

    if (queue_count == 0) {
        int atexit_result = atexit(&clean_up_messaging);

        if (atexit_result != 0) {
            fprintf(stderr, "could not register clean up code\n");
            return -1;
        }
    }

    tmp = (CgreenMessageQueue *) realloc(queues, sizeof(CgreenMessageQueue) * ++queue_count);
    if (tmp == NULL) {
        /* ignoring return value here, as the world is ending anyways */
        (void)atexit(&clean_up_messaging);
        return -1;
    }
    queues = tmp;

    pipe_result = cgreen_pipe_open(pipes);
    if (pipe_result != 0) {
        fprintf(stderr, "could not create pipes\n");
        return -1;
    }

    queues[queue_count - 1].readpipe = pipes[0];
    queues[queue_count - 1].writepipe = pipes[1];
    queues[queue_count - 1].owner = getpid();
    queues[queue_count - 1].tag = tag;
    return queue_count - 1;
}